

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Intersect(Relation *this,shared_ptr<duckdb::Relation,_true> *other)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  SetOperationType *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  bool local_39;
  enable_shared_from_this<duckdb::Relation> local_38;
  shared_ptr<duckdb::Relation,_true> local_28;
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_38);
  local_39 = true;
  make_shared_ptr<duckdb::SetOpRelation,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::shared_ptr<duckdb::Relation,true>const&,duckdb::SetOperationType,bool>
            (&local_28,(shared_ptr<duckdb::Relation,_true> *)&local_38,in_RDX,&local_39);
  _Var1._M_pi = local_28.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_28.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_28.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_28.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.__weak_this_.internal.
              super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Intersect(const shared_ptr<Relation> &other) {
	return make_shared_ptr<SetOpRelation>(shared_from_this(), other, SetOperationType::INTERSECT, true);
}